

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::
btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
::decrement_slow(btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
                 *this)

{
  btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
  bVar1;
  int iVar2;
  btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
  *pbVar3;
  undefined8 uVar4;
  bool bVar5;
  btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
  bVar6;
  byte bVar7;
  btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
  *pbVar8;
  btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
  *pbVar9;
  char *__function;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
  save;
  int iStack_20;
  
  pbVar9 = this->node_;
  if (((ulong)pbVar9 & 7) != 0) {
LAB_0024a23b:
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, Offset..." /* TRUNCATED STRING LITERAL */
    ;
LAB_0024a286:
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,__function);
  }
  iVar2 = this->position_;
  if (pbVar9[0xb] ==
      (btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
       )0x0) {
    bVar7 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
            ::start(pbVar9);
    if (iVar2 < (int)(uint)bVar7) {
      __assert_fail("position_ >= node_->start()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                    ,0x876,
                    "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>>, const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry &, const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry *>::decrement_slow() [Node = absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>>, Reference = const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry &, Pointer = const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry *]"
                   );
    }
    pbVar9 = this->node_;
    bVar1 = *(btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
              *)&this->position_;
    do {
      pbVar9 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
               ::child(pbVar9,(field_type)bVar1);
      this->node_ = pbVar9;
      if (((ulong)pbVar9 & 7) != 0) goto LAB_0024a23b;
      bVar1 = pbVar9[10];
    } while (pbVar9[0xb] ==
             (btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
              )0x0);
    this->position_ = (byte)bVar1 - 1;
  }
  else {
    if (-1 < iVar2) {
      __assert_fail("position_ <= -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                    ,0x86a,
                    "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>>, const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry &, const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry *>::decrement_slow() [Node = absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>>, Reference = const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry &, Pointer = const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry *]"
                   );
    }
    pbVar3 = this->node_;
    uVar4 = *(undefined8 *)&this->position_;
    btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
    ::start(pbVar9);
    do {
      bVar5 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
              ::is_root(this->node_);
      if (bVar5) break;
      pbVar9 = this->node_;
      if (((ulong)pbVar9 & 7) != 0) {
        __function = 
        "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, Offset..." /* TRUNCATED STRING LITERAL */
        ;
        goto LAB_0024a286;
      }
      pbVar8 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
               ::child(*(btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                         **)pbVar9,(field_type)pbVar9[8]);
      pbVar9 = this->node_;
      if (pbVar8 != pbVar9) {
        __assert_fail("node_->parent()->child(node_->position()) == node_",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                      ,0x86d,
                      "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>>, const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry &, const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry *>::decrement_slow() [Node = absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>>, Reference = const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry &, Pointer = const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry *]"
                     );
      }
      if (((ulong)pbVar8 & 7) != 0) goto LAB_0024a23b;
      bVar1 = pbVar9[8];
      this->position_ = (byte)bVar1 - 1;
      pbVar9 = *(btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                 **)pbVar9;
      this->node_ = pbVar9;
      bVar6 = (btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
               )btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                ::start(pbVar9);
    } while ((byte)bVar1 <= (byte)bVar6);
    iVar2 = this->position_;
    bVar7 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
            ::start(this->node_);
    if (iVar2 < (int)(uint)bVar7) {
      iStack_20 = (int)uVar4;
      this->position_ = iStack_20;
      this->node_ = pbVar3;
    }
  }
  return;
}

Assistant:

void btree_iterator<N, R, P>::decrement_slow() {
  if (node_->is_leaf()) {
    assert(position_ <= -1);
    btree_iterator save(*this);
    while (position_ < node_->start() && !node_->is_root()) {
      assert(node_->parent()->child(node_->position()) == node_);
      position_ = node_->position() - 1;
      node_ = node_->parent();
    }
    // TODO(ezb): assert we aren't decrementing begin() instead of handling.
    if (position_ < node_->start()) {
      *this = save;
    }
  } else {
    assert(position_ >= node_->start());
    node_ = node_->child(static_cast<field_type>(position_));
    while (node_->is_internal()) {
      node_ = node_->child(node_->finish());
    }
    position_ = node_->finish() - 1;
  }
}